

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectsContext.cpp
# Opt level: O0

void __thiscall
ObjectsContext::WriteEncodedHexString
          (ObjectsContext *this,string *inString,ETokenSeparator inSeparate)

{
  bool bVar1;
  string local_40;
  ETokenSeparator local_1c;
  string *psStack_18;
  ETokenSeparator inSeparate_local;
  string *inString_local;
  ObjectsContext *this_local;
  
  local_1c = inSeparate;
  psStack_18 = inString;
  inString_local = (string *)this;
  bVar1 = IsEncrypting(this);
  if (bVar1) {
    DecodeHexString(&local_40,this,psStack_18);
    WriteHexString(this,&local_40,local_1c);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    PrimitiveObjectsWriter::WriteEncodedHexString(&this->mPrimitiveWriter,psStack_18,local_1c);
  }
  return;
}

Assistant:

void ObjectsContext::WriteEncodedHexString(const std::string& inString, ETokenSeparator inSeparate) 
{
	if (IsEncrypting())
	{
		WriteHexString(DecodeHexString(inString), inSeparate);
	}
	else {
		mPrimitiveWriter.WriteEncodedHexString(inString, inSeparate);
	}
}